

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nlsol_ex_sol.h
# Opt level: O3

void __thiscall ExampleSOLHandler::PrintSolution(ExampleSOLHandler *this,string *stub)

{
  ExampleModel *pEVar1;
  _Rb_tree_node_base *p_Var2;
  pointer pdVar3;
  pointer pdVar4;
  pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<double,_std::allocator<double>_>_>
  suf;
  pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<double,_std::allocator<double>_>_>
  local_70;
  
  printf("\n     ********** SOLUTION (%s.sol) ***********\n",(stub->_M_dataplus)._M_p);
  puts("Duals:");
  pdVar3 = (this->mdl_->sol_y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pdVar4 = (this->mdl_->sol_y_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start; pdVar4 != pdVar3; pdVar4 = pdVar4 + 1) {
    printf("%.17g\t",*pdVar4);
  }
  printf("\n%s\n","Primals:");
  pEVar1 = this->mdl_;
  pdVar4 = (pEVar1->sol_x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar3 = (pEVar1->sol_x_).super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pdVar4 != pdVar3) {
    do {
      printf("%.17g\t",*pdVar4);
      pdVar4 = pdVar4 + 1;
    } while (pdVar4 != pdVar3);
    pEVar1 = this->mdl_;
  }
  printf("\nObjno used: %d, solve_result_num: %d\n",(ulong)(pEVar1->objno_ + 1),
         (ulong)(uint)pEVar1->solve_result_);
  printf("\n%s\n","Suffixes:");
  pEVar1 = this->mdl_;
  for (p_Var2 = (pEVar1->suf_out_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(pEVar1->suf_out_)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    std::
    pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<double,_std::allocator<double>_>_>
    ::pair(&local_70,
           (pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::vector<double,_std::allocator<double>_>_>
            *)(p_Var2 + 1));
    printf("  %s  [kind=%d]: ",local_70.first.first._M_dataplus._M_p,
           (ulong)(uint)local_70.first.second);
    pdVar4 = local_70.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    for (pdVar3 = local_70.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start; pdVar3 != pdVar4; pdVar3 = pdVar3 + 1) {
      printf("\t%.17g",*pdVar3);
    }
    putchar(10);
    if (local_70.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.second.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_70.second.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.second.super__Vector_base<double,_std::allocator<double>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70.first.first._M_dataplus._M_p != &local_70.first.first.field_2) {
      operator_delete(local_70.first.first._M_dataplus._M_p,
                      local_70.first.first.field_2._M_allocated_capacity + 1);
    }
  }
  putchar(10);
  return;
}

Assistant:

void ExampleSOLHandler::PrintSolution(
    const std::string& stub) {
  printf(
        "\n     ********** SOLUTION (%s.sol) ***********\n",
        stub.c_str());
  printf("%s\n", "Duals:");
  for (auto y: Model().sol_y_)
    printf("%.17g\t", y);
  printf("\n%s\n", "Primals:");
  for (auto x: Model().sol_x_)
    printf("%.17g\t", x);

  printf("\nObjno used: %d, solve_result_num: %d\n",
         Model().objno_+1, Model().solve_result_);

  printf("\n%s\n", "Suffixes:");
  for (auto suf: Model().suf_out_) {
    printf("  %s  [kind=%d]: ",
           suf.first.first.c_str(), suf.first.second);
    for (auto v: suf.second)
      printf("\t%.17g", v);
    printf("\n");
  }
  printf("%s\n", "");
}